

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::VariableDatum::VariableDatum(VariableDatum *this,DatumID ID,KString *Value)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__VariableDatum_0022d2b8;
  (this->m_v8DatumValue).
  super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_v8DatumValue).
  super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_v8DatumValue).
  super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ui32DatumID = ID;
  SetDatumValue(this,(Value->_M_dataplus)._M_p,(int)Value->_M_string_length * 8 + 8);
  return;
}

Assistant:

VariableDatum::VariableDatum( DatumID ID, const KString & Value )
{
    m_ui32DatumID = ID;

    SetDatumValue( Value );
}